

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_NetworkSelectByName_Test::TestBody
          (InterpreterTestSuite_PC_NetworkSelectByName_Test *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined8 uVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  AssertHelper local_bd0;
  Message local_bc8;
  int local_bbc;
  undefined1 local_bb8 [8];
  AssertionResult gtest_ar_7;
  Message local_ba0;
  Status local_b92;
  Status local_b91;
  undefined1 local_b90 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_b60;
  Message local_b58;
  bool local_b49;
  undefined1 local_b48 [8];
  AssertionResult gtest_ar_;
  allocator local_ae9;
  string local_ae8;
  Expression local_ac8;
  undefined1 local_ab0 [8];
  Value value;
  Expression expr;
  Message local_a48;
  int local_a3c;
  undefined1 local_a38 [8];
  AssertionResult gtest_ar_5;
  Message local_a20;
  Status local_a12;
  Status local_a11;
  undefined1 local_a10 [8];
  AssertionResult gtest_ar_4;
  Network nwk;
  Message local_998;
  Status local_98a;
  Status local_989;
  undefined1 local_988 [8];
  AssertionResult gtest_ar_3;
  undefined1 local_970 [8];
  BorderRouter br;
  Message local_7e0;
  Status local_7d1;
  UnixTime local_7d0;
  allocator local_7c1;
  string local_7c0;
  allocator local_799;
  string local_798;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_778;
  allocator local_751;
  string local_750;
  Timestamp local_730;
  allocator local_721;
  string local_720;
  allocator local_6f9;
  string local_6f8;
  allocator local_6d1;
  string local_6d0;
  State local_6b0;
  allocator local_6a9;
  string local_6a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_688;
  allocator local_669;
  string local_668;
  BorderAgent local_648;
  Status local_4c9;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_2;
  Message local_4b0;
  Status local_4a1;
  UnixTime local_4a0;
  allocator local_491;
  string local_490;
  allocator local_469;
  string local_468;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_448;
  allocator local_421;
  string local_420;
  Timestamp local_400;
  allocator local_3f1;
  string local_3f0;
  allocator local_3c9;
  string local_3c8;
  allocator local_3a1;
  string local_3a0;
  State local_380;
  allocator local_379;
  string local_378;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_358;
  allocator local_331;
  string local_330;
  BorderAgent local_310;
  Status local_191;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_178;
  Message local_170;
  void *local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  undefined1 local_140 [8];
  TestContext ctx;
  InterpreterTestSuite_PC_NetworkSelectByName_Test *this_local;
  
  ctx.mCommissionerAppStaticExpecter.gmock02_Create_150.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  InterpreterTestSuite::TestContext::TestContext((TestContext *)local_140);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,(TestContext *)local_140);
  local_168 = (void *)0x0;
  testing::internal::CmpHelperNE<ot::commissioner::persistent_storage::Registry*,decltype(nullptr)>
            ((internal *)local_160,"ctx.mRegistry","nullptr",
             (Registry **)(ctx.mInterpreter.mCancelPipe + 1),&local_168);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar2) {
    testing::Message::Message(&local_170);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x600,pcVar3);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message(&local_170);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  uVar1 = ctx.mInterpreter._192_8_;
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_330,"127.0.0.1",&local_331);
    local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_358);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_378,"1.1",&local_379);
    ot::commissioner::BorderAgent::State::State(&local_380,0,0,0,0,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a0,"net1",&local_3a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3c8,"",&local_3c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f0,"",&local_3f1);
    local_400 = (Timestamp)0x0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_420,"",&local_421);
    local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_448.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_448);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_468,"domain1",&local_469);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_490,"",&local_491);
    ot::commissioner::UnixTime::UnixTime(&local_4a0,0);
    ot::commissioner::BorderAgent::BorderAgent
              (&local_310,&local_330,0x4e21,&local_358,&local_378,local_380,&local_3a0,1,&local_3c8,
               &local_3f0,local_400,0,&local_420,&local_448,&local_468,'\0',0,&local_490,local_4a0,
               0x103f);
    local_191 = ot::commissioner::persistent_storage::Registry::Add((Registry *)uVar1,&local_310);
    local_4a1 = kSuccess;
    testing::internal::EqHelper::
    Compare<ot::commissioner::persistent_storage::Registry::Status,_ot::commissioner::persistent_storage::Registry::Status,_nullptr>
              ((EqHelper *)local_190,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x3F | BorderAgent::kDomainNameBit})"
               ,"RegistryStatus::kSuccess",&local_191,&local_4a1);
    ot::commissioner::BorderAgent::~BorderAgent(&local_310);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator((allocator<char> *)&local_469);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_448);
    std::__cxx11::string::~string((string *)&local_420);
    std::allocator<char>::~allocator((allocator<char> *)&local_421);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator((allocator<char> *)&local_379);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_358);
    std::__cxx11::string::~string((string *)&local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
    if (!bVar2) {
      testing::Message::Message(&local_4b0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x604,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_4b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_4b0);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
    uVar1 = ctx.mInterpreter._192_8_;
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_668,"127.0.0.2",&local_669);
      local_688.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_688.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_688.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_688);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_6a8,"1.1",&local_6a9);
      ot::commissioner::BorderAgent::State::State(&local_6b0,0,0,0,0,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_6d0,"net2",&local_6d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_6f8,"",&local_6f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_720,"",&local_721);
      local_730 = (Timestamp)0x0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_750,"",&local_751);
      local_778.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_778.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_778.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_778);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_798,"domain1",&local_799);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_7c0,"",&local_7c1);
      ot::commissioner::UnixTime::UnixTime(&local_7d0,0);
      pcVar3 = (char *)(ulong)(uint)local_6b0;
      ot::commissioner::BorderAgent::BorderAgent
                (&local_648,&local_668,0x4e22,&local_688,&local_6a8,local_6b0,&local_6d0,2,
                 &local_6f8,&local_720,local_730,0,&local_750,&local_778,&local_798,'\0',0,
                 &local_7c0,local_7d0,0x103f);
      local_4c9 = ot::commissioner::persistent_storage::Registry::Add((Registry *)uVar1,&local_648);
      local_7d1 = kSuccess;
      testing::internal::EqHelper::
      Compare<ot::commissioner::persistent_storage::Registry::Status,_ot::commissioner::persistent_storage::Registry::Status,_nullptr>
                ((EqHelper *)local_4c8,
                 "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x3F | BorderAgent::kDomainNameBit})"
                 ,"RegistryStatus::kSuccess",&local_4c9,&local_7d1);
      ot::commissioner::BorderAgent::~BorderAgent(&local_648);
      std::__cxx11::string::~string((string *)&local_7c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
      std::__cxx11::string::~string((string *)&local_798);
      std::allocator<char>::~allocator((allocator<char> *)&local_799);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_778);
      std::__cxx11::string::~string((string *)&local_750);
      std::allocator<char>::~allocator((allocator<char> *)&local_751);
      std::__cxx11::string::~string((string *)&local_720);
      std::allocator<char>::~allocator((allocator<char> *)&local_721);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
      std::__cxx11::string::~string((string *)&local_6d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
      std::__cxx11::string::~string((string *)&local_6a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_688);
      std::__cxx11::string::~string((string *)&local_668);
      std::allocator<char>::~allocator((allocator<char> *)&local_669);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
      if (!bVar2) {
        testing::Message::Message(&local_7e0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&br.mAgent.mPresentFlags,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x608,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&br.mAgent.mPresentFlags,&local_7e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&br.mAgent.mPresentFlags);
        testing::Message::~Message(&local_7e0);
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
      if (gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        ot::commissioner::persistent_storage::BorderRouter::BorderRouter((BorderRouter *)local_970);
        ot::commissioner::persistent_storage::NetworkId::NetworkId
                  ((NetworkId *)
                   ((long)&gtest_ar_3.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   + 4),1);
        br._vptr_BorderRouter._4_4_ =
             gtest_ar_3.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._4_4_;
        local_989 = ot::commissioner::persistent_storage::Registry::SetCurrentNetwork
                              ((Registry *)ctx.mInterpreter._192_8_,(BorderRouter *)local_970);
        local_98a = kSuccess;
        testing::internal::EqHelper::
        Compare<ot::commissioner::persistent_storage::Registry::Status,_ot::commissioner::persistent_storage::Registry::Status,_nullptr>
                  ((EqHelper *)local_988,"ctx.mRegistry->SetCurrentNetwork(br)",
                   "RegistryStatus::kSuccess",&local_989,&local_98a);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_988);
        if (!bVar2) {
          testing::Message::Message(&local_998);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_988);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&nwk.mCcm,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x60b,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&nwk.mCcm,&local_998);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nwk.mCcm);
          testing::Message::~Message(&local_998);
        }
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_988);
        if (gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          ot::commissioner::persistent_storage::Network::Network((Network *)&gtest_ar_4.message_);
          local_a11 = ot::commissioner::persistent_storage::Registry::GetCurrentNetwork
                                ((Registry *)ctx.mInterpreter._192_8_,
                                 (Network *)&gtest_ar_4.message_);
          local_a12 = kSuccess;
          testing::internal::EqHelper::
          Compare<ot::commissioner::persistent_storage::Registry::Status,_ot::commissioner::persistent_storage::Registry::Status,_nullptr>
                    ((EqHelper *)local_a10,"ctx.mRegistry->GetCurrentNetwork(nwk)",
                     "RegistryStatus::kSuccess",&local_a11,&local_a12);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a10);
          if (!bVar2) {
            testing::Message::Message(&local_a20);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a10);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x60e,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_a20);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_a20);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_a10);
          local_a3c = 1;
          testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
                    ((EqHelper *)local_a38,"1","nwk.mId.mId",&local_a3c,(uint *)&gtest_ar_4.message_
                    );
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a38);
          if (!bVar2) {
            testing::Message::Message(&local_a48);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a38);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)
                       &expr.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x60f,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)
                       &expr.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_a48);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)
                       &expr.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            testing::Message::~Message(&local_a48);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_a38);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&value.mData.field_2 + 8));
          ot::commissioner::Interpreter::Value::Value((Value *)local_ab0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_ae8,"Network select net1",&local_ae9);
          ot::commissioner::Interpreter::ParseExpression
                    (&local_ac8,(Interpreter *)local_140,&local_ae8);
          this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&value.mData.field_2 + 8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(this_00,&local_ac8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_ac8);
          std::__cxx11::string::~string((string *)&local_ae8);
          std::allocator<char>::~allocator((allocator<char> *)&local_ae9);
          ot::commissioner::Interpreter::Eval
                    ((Value *)&gtest_ar_.message_,(Interpreter *)local_140,this_00);
          ot::commissioner::Interpreter::Value::operator=
                    ((Value *)local_ab0,(Value *)&gtest_ar_.message_);
          ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_.message_);
          local_b49 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_ab0);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_b48,&local_b49,(type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b48);
          if (!bVar2) {
            testing::Message::Message(&local_b58);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_6.message_,(internal *)local_b48,
                       (AssertionResult *)0x46a487,"false","true",pcVar3);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_b60,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x616,pcVar3);
            testing::internal::AssertHelper::operator=(&local_b60,&local_b58);
            testing::internal::AssertHelper::~AssertHelper(&local_b60);
            std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
            testing::Message::~Message(&local_b58);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_b48);
          local_b91 = ot::commissioner::persistent_storage::Registry::GetCurrentNetwork
                                ((Registry *)ctx.mInterpreter._192_8_,
                                 (Network *)&gtest_ar_4.message_);
          local_b92 = kSuccess;
          testing::internal::EqHelper::
          Compare<ot::commissioner::persistent_storage::Registry::Status,_ot::commissioner::persistent_storage::Registry::Status,_nullptr>
                    ((EqHelper *)local_b90,"ctx.mRegistry->GetCurrentNetwork(nwk)",
                     "RegistryStatus::kSuccess",&local_b91,&local_b92);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b90);
          if (!bVar2) {
            testing::Message::Message(&local_ba0);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b90);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x617,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_7.message_,&local_ba0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
            testing::Message::~Message(&local_ba0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_b90);
          local_bbc = 0;
          testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
                    ((EqHelper *)local_bb8,"0","nwk.mId.mId",&local_bbc,(uint *)&gtest_ar_4.message_
                    );
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bb8);
          if (!bVar2) {
            testing::Message::Message(&local_bc8);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_bb8);
            testing::internal::AssertHelper::AssertHelper
                      (&local_bd0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x618,pcVar3);
            testing::internal::AssertHelper::operator=(&local_bd0,&local_bc8);
            testing::internal::AssertHelper::~AssertHelper(&local_bd0);
            testing::Message::~Message(&local_bc8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_bb8);
          ot::commissioner::Interpreter::Value::~Value((Value *)local_ab0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&value.mData.field_2 + 8));
          ot::commissioner::persistent_storage::Network::~Network((Network *)&gtest_ar_4.message_);
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ = 0;
        }
        ot::commissioner::persistent_storage::BorderRouter::~BorderRouter((BorderRouter *)local_970)
        ;
      }
    }
  }
  InterpreterTestSuite::TestContext::~TestContext((TestContext *)local_140);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_NetworkSelectByName)
{
    TestContext ctx;
    InitContext(ctx);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x3F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x3F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    BorderRouter br;
    br.mNetworkId = 1;
    ASSERT_EQ(ctx.mRegistry->SetCurrentNetwork(br), RegistryStatus::kSuccess);

    Network nwk;
    EXPECT_EQ(ctx.mRegistry->GetCurrentNetwork(nwk), RegistryStatus::kSuccess);
    EXPECT_EQ(1, nwk.mId.mId);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("Network select net1");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
    EXPECT_EQ(ctx.mRegistry->GetCurrentNetwork(nwk), RegistryStatus::kSuccess);
    EXPECT_EQ(0, nwk.mId.mId);
}